

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_addmul_v_s128_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 (*in_RDX) [16];
  word *in_RSI;
  ulong *in_RDI;
  undefined8 uVar5;
  undefined8 uVar6;
  uint i;
  word idx;
  uint w;
  word128 cval [4];
  block_t *Ablock;
  word *vptr;
  block_t *cblock;
  int local_2dc;
  word local_2d8;
  int local_2cc;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  undefined1 (*local_288) [16];
  word *local_280;
  ulong local_198;
  ulong uStack_190;
  ulong local_148;
  ulong uStack_140;
  ulong local_f8;
  ulong uStack_f0;
  ulong local_a8;
  ulong uStack_a0;
  
  local_2c8 = *in_RDI;
  uStack_2c0 = in_RDI[1];
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_288 = in_RDX;
  local_280 = in_RSI;
  for (local_2cc = 2; local_2cc != 0; local_2cc = local_2cc + -1) {
    local_2d8 = *local_280;
    for (local_2dc = 0x40; local_2dc != 0; local_2dc = local_2dc + -4) {
      uVar5 = *(undefined8 *)*local_288;
      uVar6 = *(undefined8 *)(*local_288 + 8);
      auVar2 = *local_288;
      mm128_compute_mask(local_2d8,0);
      auVar1._8_8_ = uVar6;
      auVar1._0_8_ = uVar5;
      auVar1 = vpand_avx(auVar2,auVar1);
      local_a8 = auVar1._0_8_;
      uStack_a0 = auVar1._8_8_;
      uVar5 = *(undefined8 *)local_288[1];
      uVar6 = *(undefined8 *)(local_288[1] + 8);
      auVar1 = local_288[1];
      mm128_compute_mask(local_2d8,1);
      auVar2._8_8_ = uVar6;
      auVar2._0_8_ = uVar5;
      auVar1 = vpand_avx(auVar1,auVar2);
      local_f8 = auVar1._0_8_;
      uStack_f0 = auVar1._8_8_;
      uVar5 = *(undefined8 *)local_288[2];
      uVar6 = *(undefined8 *)(local_288[2] + 8);
      auVar1 = local_288[2];
      mm128_compute_mask(local_2d8,2);
      auVar3._8_8_ = uVar6;
      auVar3._0_8_ = uVar5;
      auVar1 = vpand_avx(auVar1,auVar3);
      local_148 = auVar1._0_8_;
      uStack_140 = auVar1._8_8_;
      local_2c8 = local_2c8 ^ local_a8 ^ local_148;
      uStack_2c0 = uStack_2c0 ^ uStack_a0 ^ uStack_140;
      uVar5 = *(undefined8 *)local_288[3];
      uVar6 = *(undefined8 *)(local_288[3] + 8);
      auVar1 = local_288[3];
      mm128_compute_mask(local_2d8,3);
      auVar4._8_8_ = uVar6;
      auVar4._0_8_ = uVar5;
      auVar1 = vpand_avx(auVar1,auVar4);
      local_198 = auVar1._0_8_;
      uStack_190 = auVar1._8_8_;
      local_2b8 = local_2b8 ^ local_f8 ^ local_198;
      uStack_2b0 = uStack_2b0 ^ uStack_f0 ^ uStack_190;
      local_2d8 = local_2d8 >> 4;
      local_288 = local_288 + 4;
    }
    local_280 = local_280 + 1;
  }
  *in_RDI = local_2c8 ^ local_2b8;
  in_RDI[1] = uStack_2c0 ^ uStack_2b0;
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_addmul_v_s128_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[4] = {mm128_load(cblock->w64), mm128_zero, mm128_zero, mm128_zero};
  for (unsigned int w = 2; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 4, idx >>= 4, Ablock += 2) {
      cval[0] = mm128_xor_mask(cval[0], mm128_load(&Ablock[0].w64[0]), mm128_compute_mask(idx, 0));
      cval[1] = mm128_xor_mask(cval[1], mm128_load(&Ablock[0].w64[2]), mm128_compute_mask(idx, 1));
      cval[0] = mm128_xor_mask(cval[0], mm128_load(&Ablock[1].w64[0]), mm128_compute_mask(idx, 2));
      cval[1] = mm128_xor_mask(cval[1], mm128_load(&Ablock[1].w64[2]), mm128_compute_mask(idx, 3));
    }
  }
  mm128_store(cblock->w64, mm128_xor(cval[0], cval[1]));
}